

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderAtomicCountersTests.cpp
# Opt level: O0

string * __thiscall
glcts::AdvancedUsageDrawUpdateDraw::Purpose_abi_cxx11_
          (string *__return_storage_ptr__,AdvancedUsageDrawUpdateDraw *this)

{
  allocator<char> local_19;
  AdvancedUsageDrawUpdateDraw *local_18;
  AdvancedUsageDrawUpdateDraw *this_local;
  
  local_18 = this;
  this_local = (AdvancedUsageDrawUpdateDraw *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "\n1. Create atomic counter buffers and init them with start values.\n2. Increment (decrement) buffer values in the shader.\n3. Map buffers with MapBufferRange command. Increment (decrement) buffer values manually.\n4. Unmap buffers with UnmapBuffer command.\n5. Again increment (decrement) buffer values in the shader.\nVerify that this scenario works as expected and final values in the buffer objects are correct."
             ,&local_19);
  std::allocator<char>::~allocator(&local_19);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string Purpose()
	{
		return NL "1. Create atomic counter buffers and init them with start values." NL
				  "2. Increment (decrement) buffer values in the shader." NL
				  "3. Map buffers with MapBufferRange command. Increment (decrement) buffer values manually." NL
				  "4. Unmap buffers with UnmapBuffer command." NL
				  "5. Again increment (decrement) buffer values in the shader." NL
				  "Verify that this scenario works as expected and final values in the buffer objects are correct.";
	}